

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

void __thiscall capnp::DynamicValue::Reader::Reader(Reader *this,ConstSchema constant)

{
  Which WVar1;
  PointerReader reader;
  PointerReader reader_00;
  byte bVar2;
  StructSchema schema;
  EnumSchema EVar3;
  undefined2 uVar4;
  StructDataBitCount SVar5;
  bool bVar6;
  Type TVar7;
  ListSchema schema_00;
  Fault f;
  undefined1 auStack_e0 [12];
  undefined4 uStack_d4;
  undefined8 uStack_d0;
  StructDataBitCount local_c8;
  undefined4 uStack_c4;
  undefined8 uStack_c0;
  Reader value;
  Type type;
  undefined1 local_58 [40];
  byte *pbStack_30;
  ConstSchema constant_local;
  
  this->type = VOID;
  constant_local = constant;
  TVar7 = ConstSchema::getType((ConstSchema *)&constant_local.super_Schema);
  type = TVar7;
  Schema::getProto((Reader *)local_58,&constant_local.super_Schema);
  f.exception._4_4_ = local_58._4_4_;
  auStack_e0._4_4_ = local_58._12_4_;
  auStack_e0._0_4_ = local_58._8_4_;
  uStack_d0._4_4_ = local_58._28_4_;
  uStack_d0._0_4_ = local_58._24_4_;
  _local_c8 = local_58._32_8_;
  uStack_c0 = pbStack_30;
  stack0xffffffffffffff28 = local_58._16_8_;
  capnp::schema::Node::Const::Reader::getValue(&value,(Reader *)&f);
  WVar1 = LIST;
  if (((undefined1  [16])TVar7 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
    WVar1 = TVar7.baseType;
  }
  switch(WVar1) {
  case VOID:
    f.exception._0_4_ = 1;
    operator=(this,(Reader *)&f);
    break;
  case BOOL:
    if (value._reader.dataSize < 0x11) {
      bVar2 = 0;
    }
    else {
      bVar2 = *(byte *)((long)value._reader.data + 2) & 1;
    }
    f.exception._0_4_ = 2;
    auStack_e0[0] = bVar2;
    operator=(this,(Reader *)&f);
    break;
  case INT8:
    if (value._reader.dataSize < 0x18) {
      auStack_e0._0_8_ = (char *)0x0;
    }
    else {
      auStack_e0._0_8_ = SEXT18(*(char *)((long)value._reader.data + 2));
    }
    f.exception._0_4_ = 3;
    operator=(this,(Reader *)&f);
    break;
  case INT16:
    if (value._reader.dataSize < 0x20) {
      auStack_e0._0_8_ = (char *)0x0;
    }
    else {
      auStack_e0._0_8_ = SEXT28(*(short *)((long)value._reader.data + 2));
    }
    f.exception._0_4_ = 3;
    operator=(this,(Reader *)&f);
    break;
  case INT32:
    if (value._reader.dataSize < 0x40) {
      auStack_e0._0_8_ = (char *)0x0;
    }
    else {
      auStack_e0._0_8_ = SEXT48(*(int *)((long)value._reader.data + 4));
    }
    f.exception._0_4_ = 3;
    operator=(this,(Reader *)&f);
    break;
  case INT64:
    if (value._reader.dataSize < 0x80) {
      auStack_e0._0_8_ = (char *)0x0;
    }
    else {
      auStack_e0._0_8_ = *(undefined8 *)((long)value._reader.data + 8);
    }
    f.exception._0_4_ = 3;
    operator=(this,(Reader *)&f);
    break;
  case UINT8:
    if (value._reader.dataSize < 0x18) {
      auStack_e0._0_8_ = (char *)0x0;
    }
    else {
      auStack_e0._0_8_ = ZEXT18(*(byte *)((long)value._reader.data + 2));
    }
    f.exception._0_4_ = 4;
    operator=(this,(Reader *)&f);
    break;
  case UINT16:
    if (value._reader.dataSize < 0x20) {
      auStack_e0._0_8_ = (char *)0x0;
    }
    else {
      auStack_e0._0_8_ = ZEXT28(*(ushort *)((long)value._reader.data + 2));
    }
    f.exception._0_4_ = 4;
    operator=(this,(Reader *)&f);
    break;
  case UINT32:
    if (value._reader.dataSize < 0x40) {
      auStack_e0._0_8_ = (char *)0x0;
    }
    else {
      auStack_e0._0_8_ = ZEXT48(*(uint *)((long)value._reader.data + 4));
    }
    f.exception._0_4_ = 4;
    operator=(this,(Reader *)&f);
    break;
  case UINT64:
    if (value._reader.dataSize < 0x80) {
      auStack_e0._0_8_ = (char *)0x0;
    }
    else {
      auStack_e0._0_8_ = *(undefined8 *)((long)value._reader.data + 8);
    }
    f.exception._0_4_ = 4;
    operator=(this,(Reader *)&f);
    break;
  case FLOAT32:
    auStack_e0._0_8_ = (char *)0x0;
    if (0x3f < value._reader.dataSize) {
      auStack_e0._0_8_ = (undefined8)*(float *)((long)value._reader.data + 4);
    }
    f.exception._0_4_ = 5;
    operator=(this,(Reader *)&f);
    break;
  case FLOAT64:
    auStack_e0._0_4_ = 0;
    auStack_e0._4_4_ = 0;
    if (0x7f < value._reader.dataSize) {
      auStack_e0._0_4_ = (undefined4)*(undefined8 *)((long)value._reader.data + 8);
      auStack_e0._4_4_ = (undefined4)((ulong)*(undefined8 *)((long)value._reader.data + 8) >> 0x20);
    }
    f.exception._0_4_ = 5;
    operator=(this,(Reader *)&f);
    break;
  case TEXT:
    _auStack_e0 = (undefined1  [16])capnp::schema::Value::Reader::getText(&value);
    f.exception._0_4_ = 6;
    operator=(this,(Reader *)&f);
    break;
  case DATA:
    _auStack_e0 = (undefined1  [16])capnp::schema::Value::Reader::getData(&value);
    f.exception._0_4_ = 7;
    operator=(this,(Reader *)&f);
    break;
  case LIST:
    bVar6 = value._reader.pointerCount != 0;
    local_58._16_8_ = (WirePointer *)0x0;
    if (bVar6) {
      local_58._16_8_ = value._reader.pointers;
    }
    local_58._24_4_ = 0x7fffffff;
    if (bVar6) {
      local_58._24_4_ = value._reader.nestingLimit;
    }
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
    local_58._8_4_ = 0;
    local_58._12_4_ = 0;
    if (bVar6) {
      local_58._0_4_ = value._reader.segment._0_4_;
      local_58._4_4_ = value._reader.segment._4_4_;
      local_58._8_4_ = value._reader.capTable._0_4_;
      local_58._12_4_ = value._reader.capTable._4_4_;
    }
    schema_00 = Type::asList(&type);
    reader_00.segment._4_4_ = local_58._4_4_;
    reader_00.segment._0_4_ = local_58._0_4_;
    reader_00.capTable._4_4_ = local_58._12_4_;
    reader_00.capTable._0_4_ = local_58._8_4_;
    reader_00._28_4_ = local_58._28_4_;
    reader_00.nestingLimit = local_58._24_4_;
    reader_00.pointer = (WirePointer *)local_58._16_8_;
    _::PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic
              ((Reader *)auStack_e0,reader_00,schema_00);
    f.exception._0_4_ = 8;
    operator=(this,(Reader *)&f);
    break;
  case ENUM:
    EVar3 = Type::asEnum(&type);
    if (value._reader.dataSize < 0x20) {
      uVar4 = 0;
    }
    else {
      uVar4 = *(undefined2 *)((long)value._reader.data + 2);
    }
    f.exception._0_4_ = 9;
    auStack_e0._8_2_ = uVar4;
    auStack_e0._0_8_ = EVar3.super_Schema.raw;
    operator=(this,(Reader *)&f);
    break;
  case STRUCT:
    bVar6 = value._reader.pointerCount != 0;
    local_58._16_8_ = (WirePointer *)0x0;
    if (bVar6) {
      local_58._16_8_ = value._reader.pointers;
    }
    local_58._24_4_ = 0x7fffffff;
    if (bVar6) {
      local_58._24_4_ = value._reader.nestingLimit;
    }
    local_58._0_4_ = 0;
    local_58._4_4_ = 0;
    local_58._8_4_ = 0;
    local_58._12_4_ = 0;
    if (bVar6) {
      local_58._0_4_ = value._reader.segment._0_4_;
      local_58._4_4_ = value._reader.segment._4_4_;
      local_58._8_4_ = value._reader.capTable._0_4_;
      local_58._12_4_ = value._reader.capTable._4_4_;
    }
    schema = Type::asStruct(&type);
    reader.segment._4_4_ = local_58._4_4_;
    reader.segment._0_4_ = local_58._0_4_;
    reader.capTable._4_4_ = local_58._12_4_;
    reader.capTable._0_4_ = local_58._8_4_;
    reader._28_4_ = local_58._28_4_;
    reader.nestingLimit = local_58._24_4_;
    reader.pointer = (WirePointer *)local_58._16_8_;
    _::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
              ((Reader *)auStack_e0,reader,schema);
    f.exception._0_4_ = 10;
    operator=(this,(Reader *)&f);
    break;
  case INTERFACE:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[37]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x5bc,FAILED,(char *)0x0,"\"Constants can\'t have interface type.\"",
               (char (*) [37])"Constants can\'t have interface type.");
    kj::_::Debug::Fault::fatal(&f);
  case ANY_POINTER:
    bVar6 = value._reader.pointerCount != 0;
    uStack_d0 = (SegmentReader *)0x0;
    if (bVar6) {
      uStack_d0 = value._reader.pointers;
    }
    SVar5 = 0x7fffffff;
    if (bVar6) {
      SVar5 = value._reader.nestingLimit;
    }
    auStack_e0._0_4_ = 0;
    auStack_e0._4_4_ = 0;
    auStack_e0._8_4_ = 0;
    uStack_d4 = 0;
    if (bVar6) {
      auStack_e0._0_4_ = value._reader.segment._0_4_;
      auStack_e0._4_4_ = value._reader.segment._4_4_;
      auStack_e0._8_4_ = value._reader.capTable._0_4_;
      uStack_d4 = value._reader.capTable._4_4_;
    }
    f.exception._0_4_ = 0xc;
    local_c8 = SVar5;
    operator=(this,(Reader *)&f);
    break;
  default:
    goto switchD_001ac6c8_default;
  }
  ~Reader((Reader *)&f);
switchD_001ac6c8_default:
  return;
}

Assistant:

DynamicValue::Reader::Reader(ConstSchema constant): type(VOID) {
  auto type = constant.getType();
  auto value = constant.getProto().getConst().getValue();
  switch (type.which()) {
    case schema::Type::VOID: *this = capnp::VOID; break;
    case schema::Type::BOOL: *this = value.getBool(); break;
    case schema::Type::INT8: *this = value.getInt8(); break;
    case schema::Type::INT16: *this = value.getInt16(); break;
    case schema::Type::INT32: *this = value.getInt32(); break;
    case schema::Type::INT64: *this = value.getInt64(); break;
    case schema::Type::UINT8: *this = value.getUint8(); break;
    case schema::Type::UINT16: *this = value.getUint16(); break;
    case schema::Type::UINT32: *this = value.getUint32(); break;
    case schema::Type::UINT64: *this = value.getUint64(); break;
    case schema::Type::FLOAT32: *this = value.getFloat32(); break;
    case schema::Type::FLOAT64: *this = value.getFloat64(); break;
    case schema::Type::TEXT: *this = value.getText(); break;
    case schema::Type::DATA: *this = value.getData(); break;

    case schema::Type::ENUM:
      *this = DynamicEnum(type.asEnum(), value.getEnum());
      break;

    case schema::Type::STRUCT:
      *this = value.getStruct().getAs<DynamicStruct>(type.asStruct());
      break;

    case schema::Type::LIST:
      *this = value.getList().getAs<DynamicList>(type.asList());
      break;

    case schema::Type::ANY_POINTER:
      *this = value.getAnyPointer();
      break;

    case schema::Type::INTERFACE:
      KJ_FAIL_ASSERT("Constants can't have interface type.");
  }
}